

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::appendLinearJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  undefined8 uVar1;
  Joint *pJVar2;
  btTransform *pbVar3;
  btVector3 bVar4;
  btTransform local_70;
  
  pJVar2 = (Joint *)btAlignedAllocInternal(0xd8,0x10);
  memset(pJVar2->m_refs,0,0xa0);
  pJVar2->_vptr_Joint = (_func_int **)&PTR__Joint_001f2460;
  pJVar2->m_bodies[0].m_soft = body0;
  *(btRigidBody **)((long)pJVar2->m_bodies + 8) = (btRigidBody *)0x0;
  *(btCollisionObject **)((long)pJVar2->m_bodies + 0x10) = (btCollisionObject *)0x0;
  ((Body *)((long)pJVar2->m_bodies + 0x18))->m_soft = body1.m_soft;
  *(btRigidBody **)((long)pJVar2->m_bodies + 0x20) = body1.m_rigid;
  *(btCollisionObject **)((long)pJVar2->m_bodies + 0x28) = body1.m_collisionObject;
  pbVar3 = Body::xform(pJVar2->m_bodies);
  btTransform::inverse(&local_70,pbVar3);
  bVar4 = btTransform::operator()(&local_70,&specs->position);
  *&pJVar2->m_refs[0].m_floats = bVar4.m_floats;
  pbVar3 = Body::xform((Body *)((long)pJVar2->m_bodies + 0x18));
  btTransform::inverse(&local_70,pbVar3);
  bVar4 = btTransform::operator()(&local_70,&specs->position);
  *&((btVector3 *)((long)pJVar2->m_refs + 0x10))->m_floats = bVar4.m_floats;
  uVar1 = *(undefined8 *)specs;
  pJVar2->m_cfm = (btScalar)(int)((ulong)uVar1 >> 0x20);
  pJVar2->m_erp = (btScalar)(int)uVar1;
  pJVar2->m_split = *(btScalar *)&specs->field_0x8;
  local_70.m_basis.m_el[0].m_floats._0_8_ = pJVar2;
  btAlignedObjectArray<btSoftBody::Joint_*>::push_back(&this->m_joints,(Joint **)&local_70);
  return;
}

Assistant:

void			btSoftBody::appendLinearJoint(const LJoint::Specs& specs,Cluster* body0,Body body1)
{
	LJoint*		pj	=	new(btAlignedAlloc(sizeof(LJoint),16)) LJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse()*specs.position;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse()*specs.position;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	m_joints.push_back(pj);
}